

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

uint aom_highbd_sad32x64_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  uint uVar1;
  uint uVar2;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_R8;
  uint32_t sum;
  int left_shift;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = 5;
  uVar1 = aom_highbd_sad32x32_avg_avx2
                    ((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDX >> 0x20),
                     (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_R8 >> 0x20),(uint8_t *)CONCAT44(5,in_stack_ffffffffffffffd0));
  uVar2 = aom_highbd_sad32x32_avg_avx2
                    ((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)(in_RDX + (in_ECX << 5)) >> 0x20),
                     (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)(in_R8 + 0x400) >> 0x20),(uint8_t *)CONCAT44(uVar3,uVar1));
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_highbd_sad32x64_avg_avx2(const uint8_t *src, int src_stride,
                                          const uint8_t *ref, int ref_stride,
                                          const uint8_t *second_pred) {
  const int left_shift = 5;
  uint32_t sum = aom_highbd_sad32x32_avg_avx2(src, src_stride, ref, ref_stride,
                                              second_pred);
  src += src_stride << left_shift;
  ref += ref_stride << left_shift;
  second_pred += 32 << left_shift;
  sum += aom_highbd_sad32x32_avg_avx2(src, src_stride, ref, ref_stride,
                                      second_pred);
  return sum;
}